

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O1

bool __thiscall ON_OffsetSurface::SetBaseSurface(ON_OffsetSurface *this,ON_Surface *base_surface)

{
  ON_OffsetSurface *pOVar1;
  double dVar2;
  ON_Surface *pOVar3;
  
  if (this != (ON_OffsetSurface *)base_surface) {
    if (base_surface == (ON_Surface *)0x0) {
      pOVar1 = (ON_OffsetSurface *)this->m__pSrf;
      if (pOVar1 != this && pOVar1 != (ON_OffsetSurface *)0x0) {
        (*(pOVar1->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[4])();
      }
      this->m__pSrf = (ON_Surface *)0x0;
      ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,(ON_Surface *)0x0);
      (this->m_offset_function).m_srf = (ON_Surface *)0x0;
      (this->m_offset_function).m_bZeroSideDerivative[0] = false;
      dVar2 = ON_Interval::EmptyInterval.m_t[1];
      (this->m_offset_function).m_bZeroSideDerivative[1] = false;
      (this->m_offset_function).m_bZeroSideDerivative[2] = false;
      (this->m_offset_function).m_bZeroSideDerivative[3] = false;
      *(double *)&(this->m_offset_function).field_0x8 = ON_Interval::EmptyInterval.m_t[0];
      *(double *)&(this->m_offset_function).field_0x10 = dVar2;
      dVar2 = ON_Interval::EmptyInterval.m_t[1];
      *(double *)&(this->m_offset_function).field_0x18 = ON_Interval::EmptyInterval.m_t[0];
      *(double *)&(this->m_offset_function).field_0x20 = dVar2;
      if (-1 < (this->m_offset_function).m_bumps.m_capacity) {
        (this->m_offset_function).m_bumps.m_count = 0;
      }
      (this->m_offset_function).m_bValid = false;
      (this->m_offset_function).m_srf = (ON_Surface *)0x0;
    }
    else {
      pOVar3 = ON_SurfaceProxy::ProxySurface(&this->super_ON_SurfaceProxy);
      if (pOVar3 != base_surface) {
        pOVar1 = (ON_OffsetSurface *)this->m__pSrf;
        if (pOVar1 != this && pOVar1 != (ON_OffsetSurface *)0x0) {
          (*(pOVar1->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[4])();
        }
        this->m__pSrf = (ON_Surface *)0x0;
        ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,base_surface);
      }
    }
    pOVar3 = ON_SurfaceProxy::ProxySurface(&this->super_ON_SurfaceProxy);
    ON_OffsetSurfaceFunction::SetBaseSurface(&this->m_offset_function,pOVar3);
  }
  return this != (ON_OffsetSurface *)base_surface;
}

Assistant:

bool ON_OffsetSurface::SetBaseSurface(
  const ON_Surface* base_surface
  )
{
  bool rc = false;
  if ( this != base_surface )
  {
    rc = true;
    if ( 0 == base_surface )
    {
      if ( 0 != m__pSrf && this != m__pSrf )
        delete m__pSrf;
      m__pSrf = 0;
      ON_SurfaceProxy::SetProxySurface(0);
      m_offset_function.SetBaseSurface(0);
    }
    else if ( BaseSurface() != base_surface )
    {
      if ( 0 != m__pSrf && this != m__pSrf )
        delete m__pSrf;
      m__pSrf = 0;
      ON_SurfaceProxy::SetProxySurface(base_surface);
    }
    m_offset_function.SetBaseSurface( BaseSurface() );
  }
  return rc;
}